

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cpp
# Opt level: O2

ssize_t __thiscall
Server::Private::ClientImpl::write(ClientImpl *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  undefined8 extraout_RAX;
  undefined8 uVar2;
  void *pvVar3;
  undefined8 extraout_RAX_00;
  ssize_t sVar4;
  undefined4 in_register_00000034;
  int in_R8D;
  ClientImpl *local_30;
  
  if ((this->_sendBuffer).bufferStart == (this->_sendBuffer).bufferEnd) {
    pvVar3 = (void *)Socket::send(&this->super_Socket,__fd,__buf,__n,in_R8D);
    if (pvVar3 == (void *)0x0) {
LAB_001137b0:
      if (__n != 0) {
        *(undefined8 *)__n = 0;
      }
      local_30 = this;
      HashSet<Server::Private::ClientImpl_*>::append(&this->_p->_closingClients,&local_30);
      return 0;
    }
    if (pvVar3 == (void *)0xffffffffffffffff) {
      iVar1 = Socket::getLastError();
      if (iVar1 != 0) goto LAB_001137b0;
      pvVar3 = (void *)0x0;
    }
    if (__buf < pvVar3 || (long)__buf - (long)pvVar3 == 0) {
      sVar4 = CONCAT71((int7)((ulong)pvVar3 >> 8),1);
      if (__n == 0) {
        return sVar4;
      }
      *(undefined8 *)__n = 0;
      return sVar4;
    }
    Buffer::append(&this->_sendBuffer,(byte *)CONCAT44(in_register_00000034,__fd) + (long)pvVar3,
                   (long)__buf - (long)pvVar3);
    Socket::Poll::set(&this->_p->_sockets,&this->super_Socket,this->_suspended ^ 3);
    uVar2 = extraout_RAX_00;
  }
  else {
    Buffer::append(&this->_sendBuffer,(byte *)CONCAT44(in_register_00000034,__fd),(usize)__buf);
    uVar2 = extraout_RAX;
  }
  if (__n != 0) {
    *(long *)__n = (long)(this->_sendBuffer).bufferEnd - (long)(this->_sendBuffer).bufferStart;
  }
  return CONCAT71((int7)((ulong)uVar2 >> 8),1);
}

Assistant:

bool Server::Private::ClientImpl::write(const byte *data, usize size, usize *postponed)
{
  if (_sendBuffer.isEmpty())
  {
    ssize sent = send(data, size);
    switch (sent)
    {
    case -1:
      if (Socket::getLastError() == 0) // EWOULDBLOCK
      {
        sent = 0;
        break;
      }
      // no break
    case 0:
      if (postponed)
        *postponed = 0;
      _p._closingClients.append(this);
      return false;
    default:
      break;
    }
    if ((usize)sent >= size)
    {
      if (postponed)
        *postponed = 0;
      return true;
    }
    _sendBuffer.append(data + sent, size - sent);
    _p._sockets.set(*this, _suspended ? Socket::Poll::writeFlag : (Socket::Poll::readFlag | Socket::Poll::writeFlag));
  }
  else
    _sendBuffer.append(data, size);
  if (postponed)
    *postponed = _sendBuffer.size();
  return true;
}